

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmgen_opna.cpp
# Opt level: O0

bool __thiscall FM::OPNABase::SetRate(OPNABase *this,uint c,uint r,bool param_3)

{
  uint32 local_2c;
  bool param_3_local;
  uint r_local;
  uint c_local;
  OPNABase *this_local;
  
  OPNBase::Init(&this->super_OPNBase,c >> 1,r);
  this->adplbase = (int)((((double)(this->super_OPNBase).clock / 72.0) * 8192.0) / (double)r);
  this->adpld = this->deltan * this->adplbase >> 0x10;
  OPNBase::RebuildTimeTable(&this->super_OPNBase);
  if ((this->reg22 & 8) == 0) {
    local_2c = 0;
  }
  else {
    local_2c = *(uint32 *)(OPNBase::lfotable + (long)(int)(this->reg22 & 7) * 4);
  }
  this->lfodcount = local_2c;
  return true;
}

Assistant:

bool OPNABase::SetRate(uint c, uint r, bool)
{
	c /= 2;		// �]���łƂ̌݊������d�����������R�����g�A�E�g���悤

	OPNBase::Init(c, r);

	adplbase = int(8192. * (clock/72.) / r);
	adpld = deltan * adplbase >> 16;

	RebuildTimeTable();

	lfodcount = reg22 & 0x08 ? lfotable[reg22 & 7] : 0;
	return true;
}